

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::writePATPMT(TSMuxer *this,int64_t pcr,bool force)

{
  int64_t iVar1;
  
  if (pcr == -1) {
    iVar1 = this->m_fixed_pcr_offset;
  }
  else {
    iVar1 = pcr;
    if (pcr - this->m_lastPMTPCR < (long)this->m_patPmtDelta && !force) {
      return;
    }
  }
  this->m_lastPMTPCR = iVar1;
  writePAT(this);
  writePMT(this);
  if ((!force) && (pcr - this->m_lastSITPCR < 0x12c65)) {
    return;
  }
  this->m_lastSITPCR = pcr;
  writeSIT(this);
  return;
}

Assistant:

void TSMuxer::writePATPMT(const int64_t pcr, const bool force)
{
    if (pcr == -1 || pcr - m_lastPMTPCR >= m_patPmtDelta || force)
    {
        m_lastPMTPCR = pcr != -1 ? pcr : m_fixed_pcr_offset;
        writePAT();
        writePMT();
        if (force || pcr - m_lastSITPCR > SIT_INTERVAL)
        {
            m_lastSITPCR = pcr;
            writeSIT();
        }
    }
}